

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *coScaleval,bool rowRatio)

{
  byte bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar4;
  soplex *psVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  long *plVar14;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  byte bVar17;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint local_388 [3];
  undefined3 uStack_37b;
  int iStack_378;
  bool bStack_374;
  undefined8 local_370;
  double local_368;
  soplex *local_360;
  ulong local_358;
  long local_350;
  long local_348;
  ulong local_340;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_338;
  long *local_330;
  cpp_dec_float<200U,_int,_void> local_328;
  cpp_dec_float<200U,_int,_void> local_2a8;
  cpp_dec_float<200U,_int,_void> local_228;
  fpclass_type local_1a8;
  int32_t iStack_1a4;
  undefined8 uStack_1a0;
  cpp_dec_float<200U,_int,_void> local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar17 = 0;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  local_338 = lp;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,0.0);
  psVar5 = this + 0x100;
  if ((int)coScaleval != 0) {
    psVar5 = this + 0x38;
  }
  if (0 < (int)*(uint *)psVar5) {
    local_368 = *(double *)(in_FS_OFFSET + -8);
    bVar16 = (char)coScaleval != '\0';
    local_348 = 0xe8;
    if (bVar16) {
      local_348 = 0x20;
    }
    local_350 = 0xf0;
    if (bVar16) {
      local_350 = 0x28;
    }
    local_358 = (ulong)*(uint *)psVar5;
    local_340 = 0;
    local_360 = this;
    do {
      plVar14 = (long *)((long)*(int *)(*(long *)(local_360 + local_350) + 4 + local_340 * 8) * 0x28
                        + *(long *)(local_360 + local_348));
      ::soplex::infinity::__tls_init();
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 0x1c;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems[6] = 0;
      local_2a8.data._M_elems[7] = 0;
      local_2a8.data._M_elems[8] = 0;
      local_2a8.data._M_elems[9] = 0;
      local_2a8.data._M_elems[10] = 0;
      local_2a8.data._M_elems[0xb] = 0;
      local_2a8.data._M_elems[0xc] = 0;
      local_2a8.data._M_elems[0xd] = 0;
      local_2a8.data._M_elems[0xe] = 0;
      local_2a8.data._M_elems[0xf] = 0;
      local_2a8.data._M_elems[0x10] = 0;
      local_2a8.data._M_elems[0x11] = 0;
      local_2a8.data._M_elems[0x12] = 0;
      local_2a8.data._M_elems[0x13] = 0;
      local_2a8.data._M_elems[0x14] = 0;
      local_2a8.data._M_elems[0x15] = 0;
      local_2a8.data._M_elems[0x16] = 0;
      local_2a8.data._M_elems[0x17] = 0;
      local_2a8.data._M_elems[0x18] = 0;
      local_2a8.data._M_elems[0x19] = 0;
      local_2a8.data._M_elems._104_5_ = 0;
      local_2a8.data._M_elems[0x1b]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2a8,local_368);
      local_228.fpclass = cpp_dec_float_finite;
      local_228.prec_elem = 0x1c;
      local_228.data._M_elems[0] = 0;
      local_228.data._M_elems[1] = 0;
      local_228.data._M_elems[2] = 0;
      local_228.data._M_elems[3] = 0;
      local_228.data._M_elems[4] = 0;
      local_228.data._M_elems[5] = 0;
      local_228.data._M_elems[6] = 0;
      local_228.data._M_elems[7] = 0;
      local_228.data._M_elems[8] = 0;
      local_228.data._M_elems[9] = 0;
      local_228.data._M_elems[10] = 0;
      local_228.data._M_elems[0xb] = 0;
      local_228.data._M_elems[0xc] = 0;
      local_228.data._M_elems[0xd] = 0;
      local_228.data._M_elems[0xe] = 0;
      local_228.data._M_elems[0xf] = 0;
      local_228.data._M_elems[0x10] = 0;
      local_228.data._M_elems[0x11] = 0;
      local_228.data._M_elems[0x12] = 0;
      local_228.data._M_elems[0x13] = 0;
      local_228.data._M_elems[0x14] = 0;
      local_228.data._M_elems[0x15] = 0;
      local_228.data._M_elems[0x16] = 0;
      local_228.data._M_elems[0x17] = 0;
      local_228.data._M_elems[0x18] = 0;
      local_228.data._M_elems[0x19] = 0;
      local_228.data._M_elems._104_5_ = 0;
      local_228.data._M_elems[0x1b]._1_3_ = 0;
      local_228.exp = 0;
      local_228.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_228,0.0);
      if (0 < *(int *)((long)plVar14 + 0xc)) {
        lVar8 = 0;
        lVar15 = 0;
        local_330 = plVar14;
        do {
          lVar7 = *plVar14;
          puVar9 = (uint *)(lVar7 + lVar8);
          puVar11 = local_a0;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            *puVar11 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
          }
          iVar4 = *(int *)(lVar7 + 0x70 + lVar8);
          bVar1 = *(byte *)(lVar7 + 0x74 + lVar8);
          fVar2 = *(fpclass_type *)(lVar7 + 0x78 + lVar8);
          iVar3 = *(int32_t *)(lVar7 + 0x7c + lVar8);
          local_370._0_4_ = cpp_dec_float_finite;
          local_370._4_4_ = 0x1c;
          bStack_374 = false;
          iStack_378 = 0;
          puVar9 = local_a0;
          puVar11 = (uint *)local_3e8;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar11 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
          }
          iStack_378 = iVar4;
          bStack_374 = (bool)bVar1;
          local_370._4_4_ = iVar3;
          local_370._0_4_ = fVar2;
          if ((bVar1 == 1) && (local_3e8._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
            bStack_374 = false;
          }
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                    ((local_338->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._vptr_ClassArray + (ulong)*(uint *)(*plVar14 + 0x80 + lVar8) * 0x10);
          local_328.fpclass = cpp_dec_float_finite;
          local_328.prec_elem = 0x1c;
          local_328.data._M_elems[0] = 0;
          local_328.data._M_elems[1] = 0;
          local_328.data._M_elems[2] = 0;
          local_328.data._M_elems[3] = 0;
          local_328.data._M_elems[4] = 0;
          local_328.data._M_elems[5] = 0;
          local_328.data._M_elems[6] = 0;
          local_328.data._M_elems[7] = 0;
          local_328.data._M_elems[8] = 0;
          local_328.data._M_elems[9] = 0;
          local_328.data._M_elems[10] = 0;
          local_328.data._M_elems[0xb] = 0;
          local_328.data._M_elems[0xc] = 0;
          local_328.data._M_elems[0xd] = 0;
          local_328.data._M_elems[0xe] = 0;
          local_328.data._M_elems[0xf] = 0;
          local_328.data._M_elems[0x10] = 0;
          local_328.data._M_elems[0x11] = 0;
          local_328.data._M_elems[0x12] = 0;
          local_328.data._M_elems[0x13] = 0;
          local_328.data._M_elems[0x14] = 0;
          local_328.data._M_elems[0x15] = 0;
          local_328.data._M_elems[0x16] = 0;
          local_328.data._M_elems[0x17] = 0;
          local_328.data._M_elems[0x18] = 0;
          local_328.data._M_elems[0x19] = 0;
          local_328.data._M_elems._104_5_ = 0;
          local_328.data._M_elems[0x1b]._1_3_ = 0;
          local_328.exp = 0;
          local_328.neg = false;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_3e8;
          if (&local_328 != pcVar12) {
            puVar9 = local_a0;
            pcVar10 = &local_328;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar10->data)._M_elems[0] = *puVar9;
              puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
            }
            local_328.neg = bStack_374;
            local_328.prec_elem = iVar3;
            local_328.fpclass = fVar2;
            pcVar10 = pcVar12;
            local_328.exp = iVar4;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_328,pcVar10);
          bVar16 = local_328.neg;
          iVar4 = local_328.exp;
          pcVar10 = &local_328;
          puVar9 = local_110;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar9 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4);
            puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
          }
          local_1a8 = local_328.fpclass;
          iStack_1a4 = local_328.prec_elem;
          uStack_1a0 = 0;
          this_00 = *(Tolerances **)(local_360 + 0x228);
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_360 + 0x230);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a = Tolerances::epsilon(this_00);
          puVar9 = local_110;
          pcVar10 = &local_190;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar9;
            puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar10 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          local_190.exp = iVar4;
          local_190.neg = bVar16;
          fVar2 = local_1a8;
          local_190.fpclass = local_1a8;
          local_190.prec_elem = iStack_1a4;
          if ((bVar16 != false) &&
             (local_190.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
            local_190.neg = (bool)(bVar16 ^ 1);
          }
          bVar16 = false;
          if ((fVar2 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_370._0_4_ = cpp_dec_float_finite;
            local_370._4_4_ = 0x1c;
            local_3e8 = (undefined1  [16])0x0;
            local_3d8 = (undefined1  [16])0x0;
            local_3c8 = (undefined1  [16])0x0;
            local_3b8 = (undefined1  [16])0x0;
            local_3a8 = (undefined1  [16])0x0;
            local_398 = (undefined1  [16])0x0;
            local_388[0] = 0;
            local_388[1] = 0;
            stack0xfffffffffffffc80 = 0;
            uStack_37b = 0;
            iStack_378 = 0;
            bStack_374 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_3e8,a);
            iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_190,(cpp_dec_float<200U,_int,_void> *)local_3e8);
            bVar16 = iVar4 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          plVar14 = local_330;
          if (!bVar16) {
            if (((local_328.fpclass != cpp_dec_float_NaN) &&
                (local_2a8.fpclass != cpp_dec_float_NaN)) &&
               (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_328,&local_2a8), iVar4 < 0)) {
              pcVar10 = &local_328;
              pcVar12 = &local_2a8;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4)
                ;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_2a8.exp = local_328.exp;
              local_2a8.neg = local_328.neg;
              local_2a8.fpclass = local_328.fpclass;
              local_2a8.prec_elem = local_328.prec_elem;
            }
            if (((local_328.fpclass != cpp_dec_float_NaN) &&
                (local_228.fpclass != cpp_dec_float_NaN)) &&
               (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_328,&local_228), 0 < iVar4)) {
              pcVar10 = &local_328;
              pcVar12 = &local_228;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar17 * -8 + 4)
                ;
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_228.exp = local_328.exp;
              local_228.neg = local_328.neg;
              local_228.fpclass = local_328.fpclass;
              local_228.prec_elem = local_328.prec_elem;
            }
          }
          lVar15 = lVar15 + 1;
          lVar8 = lVar8 + 0x84;
        } while (lVar15 < *(int *)((long)plVar14 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_370._0_4_ = cpp_dec_float_finite;
      local_370._4_4_ = 0x1c;
      local_3e8 = ZEXT816(0);
      local_3d8 = ZEXT816(0);
      local_3c8 = ZEXT816(0);
      local_3b8 = ZEXT816(0);
      local_3a8 = ZEXT816(0);
      local_398 = ZEXT816(0);
      local_388[0] = 0;
      local_388[1] = 0;
      stack0xfffffffffffffc80 = 0;
      uStack_37b = 0;
      iStack_378 = 0;
      bStack_374 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_3e8,local_368);
      if (((local_2a8.fpclass == cpp_dec_float_NaN) ||
          ((fpclass_type)local_370 == cpp_dec_float_NaN)) ||
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2a8,(cpp_dec_float<200U,_int,_void> *)local_3e8), iVar4 != 0)) {
        local_370._0_4_ = cpp_dec_float_finite;
        local_370._4_4_ = 0x1c;
        local_3e8 = ZEXT816(0);
        local_3d8 = ZEXT816(0);
        local_3c8 = ZEXT816(0);
        local_3b8 = ZEXT816(0);
        local_3a8 = ZEXT816(0);
        local_398 = ZEXT816(0);
        local_388[0] = 0;
        local_388[1] = 0;
        stack0xfffffffffffffc80 = 0;
        uStack_37b = 0;
        iStack_378 = 0;
        bStack_374 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_3e8,&local_228,&local_2a8);
        if ((((fpclass_type)local_370 != cpp_dec_float_NaN) &&
            ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_3e8,
                               &__return_storage_ptr__->m_backend), 0 < iVar4)) {
          puVar9 = (uint *)local_3e8;
          pnVar13 = __return_storage_ptr__;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pnVar13->m_backend).data._M_elems[0] = *puVar9;
            puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          (__return_storage_ptr__->m_backend).exp = iStack_378;
          (__return_storage_ptr__->m_backend).neg = bStack_374;
          (__return_storage_ptr__->m_backend).fpclass = (fpclass_type)local_370;
          (__return_storage_ptr__->m_backend).prec_elem = local_370._4_4_;
        }
      }
      local_340 = local_340 + 1;
    } while (local_340 != local_358);
  }
  return __return_storage_ptr__;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}